

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operations.h
# Opt level: O2

void writeOutput(string *str,string *path)

{
  char *pcVar1;
  int i;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  ostream *poVar6;
  ulong uVar7;
  int iVar8;
  undefined1 *puVar9;
  char *pcVar10;
  string realstr;
  string local_d98;
  string local_d78;
  string local_d58;
  char *local_d38;
  long local_d30;
  char *local_d18;
  long local_d10;
  char *local_cf8;
  long local_cf0;
  char *local_cd8;
  long local_cd0;
  undefined8 auStack_cc8 [2];
  string names [100];
  
  lVar5 = 0x10;
  do {
    puVar9 = (undefined1 *)((long)&names[0]._M_dataplus._M_p + lVar5);
    *(undefined1 **)((long)auStack_cc8 + lVar5) = puVar9;
    *(undefined8 *)((long)auStack_cc8 + lVar5 + 8) = 0;
    *puVar9 = 0;
    lVar5 = lVar5 + 0x20;
  } while (lVar5 != 0xc90);
  std::__cxx11::string::string((string *)&local_d98,(string *)path);
  iVar2 = parsePath(&local_d98,names);
  std::__cxx11::string::~string((string *)&local_d98);
  std::__cxx11::string::string((string *)&local_cd8,(string *)path);
  iVar3 = doesExist(names,iVar2,local_cd0 == 0 || *local_cd8 != '/');
  std::__cxx11::string::~string((string *)&local_cd8);
  pcVar1 = (str->_M_dataplus)._M_p;
  pcVar10 = "File content is illegal.";
  if ((*pcVar1 == '\"') && (pcVar1[str->_M_string_length - 1] == '\"')) {
    if (iVar3 == iVar2) {
      std::__cxx11::string::string((string *)&local_cf8,(string *)path);
      iVar3 = getId(names,iVar2,local_cf0 == 0 || *local_cf8 != '/');
      std::__cxx11::string::~string((string *)&local_cf8);
      if (inodes[iVar3].i_mode == 1) {
        poVar6 = std::operator<<((ostream *)&std::cout,(string *)path);
        std::operator<<(poVar6," is not a file.\n");
      }
      else {
        std::__cxx11::string::string((string *)&local_d18,(string *)path);
        iVar2 = getId(names,iVar2 + -1,local_d10 == 0 || *local_d18 != '/');
        std::__cxx11::string::~string((string *)&local_d18);
        lVar5 = (long)inodes[iVar3].i_blocks[0] * 0x1000;
        memset(emptyspaces + lVar5,0,0x1000);
        for (uVar7 = 1; uVar7 < str->_M_string_length - 1; uVar7 = uVar7 + 1) {
          *(char *)(lVar5 + 0x12b1cf + uVar7) = (str->_M_dataplus)._M_p[uVar7];
        }
        iVar4 = inodes[iVar3].i_file_size;
        iVar8 = (int)str->_M_string_length + -2;
        inodes[iVar3].i_file_size = iVar8;
        iVar4 = iVar4 - iVar8;
        for (; iVar2 != 0;
            iVar2 = *(int *)(emptyspaces + (long)inodes[iVar2].i_blocks[0] * 0x1000 + 0x1fc)) {
          inodes[iVar2].i_file_size = inodes[iVar2].i_file_size - iVar4;
        }
        inodes[0].i_file_size = inodes[0].i_file_size - iVar4;
      }
      goto LAB_001037f0;
    }
    if (iVar3 + 1 == iVar2) {
      std::__cxx11::string::string((string *)&local_d38,(string *)path);
      iVar3 = getId(names,iVar2 + -1,local_d30 == 0 || *local_d38 != '/');
      std::__cxx11::string::~string((string *)&local_d38);
      std::__cxx11::string::substr((ulong)&realstr,(ulong)str);
      std::__cxx11::string::string((string *)&local_d78,(string *)(names + (iVar2 + -1)));
      std::__cxx11::string::string((string *)&local_d58,(string *)&realstr);
      iVar2 = makeFileById(iVar3,&local_d78,&local_d58);
      std::__cxx11::string::~string((string *)&local_d58);
      std::__cxx11::string::~string((string *)&local_d78);
      if (iVar2 == 0) {
        poVar6 = std::operator<<((ostream *)&std::cout,"current folder is full!");
        std::endl<char,std::char_traits<char>>(poVar6);
      }
      std::__cxx11::string::~string((string *)&realstr);
      goto LAB_001037f0;
    }
    pcVar10 = "Invalid path.";
  }
  poVar6 = std::operator<<((ostream *)&std::cout,pcVar10);
  std::endl<char,std::char_traits<char>>(poVar6);
LAB_001037f0:
  lVar5 = 0xc60;
  do {
    std::__cxx11::string::~string((string *)((long)&names[0]._M_dataplus._M_p + lVar5));
    lVar5 = lVar5 + -0x20;
  } while (lVar5 != -0x20);
  return;
}

Assistant:

void writeOutput(string str, string path) {
    string names[100];
    int layers = parsePath(path, names);
    int legal_layers = doesExist(names, layers, getPathType(path) == RELATIVE_PATH);
    if (str[0] != '\"' || str[str.size() - 1] != '\"') {
        setColor(COLOR_ERR);
        cout << "File content is illegal." << endl;
        setColor(COLOR_ORIGIN);
    }
    else if (legal_layers == layers) {
        int id = getId(names, layers, getPathType(path) == RELATIVE_PATH);//找到该路径在inode中的i.id
        if (inodes[id].i_mode == A_FOLDER)
        {
            setColor(COLOR_ERR);
            cout << path << " is not a file.\n";
            setColor(COLOR_ORIGIN);
            return;
        }
        int parent_id = getId(names, layers - 1, getPathType(path) == RELATIVE_PATH);//parent id
        File_Block *p = getAddressByLocation_File(inodes[id].i_blocks[0]);
        memset(p, '\0', sizeof(File_Block));
        for (int i = 1; i < str.size() - 1; i++) {
            p->data[i - 1] = str[i];
        }
        int origin_size = inodes[id].i_file_size;
        inodes[id].i_file_size = (int) (str.size()) - 2;
        int dsize = origin_size - inodes[id].i_file_size;
        int cur = parent_id;
        while (cur)
        {
            inodes[cur].i_file_size -= dsize;
            cur = getParentById(cur);
        }
        inodes[0].i_file_size -= dsize;
    }
    else if (legal_layers + 1 == layers) {
        int id = getId(names, layers - 1, getPathType(path) == RELATIVE_PATH);//找到要创建文件所在目录的inode中的i.id
        string realstr = str.substr(1, str.size() - 2);
        if(makeFileById(id, names[layers - 1], realstr) == 0){
            cout << "current folder is full!" << endl;
            return;
        }
    }
    else {
        setColor(COLOR_ERR);
        cout << "Invalid path." << endl;
        setColor(COLOR_ORIGIN);
    }
}